

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::CollectCloneStrCandidate(BackwardPass *this,Opnd *opnd)

{
  StackSym *pSVar1;
  code *pcVar2;
  bool bVar3;
  RegOpnd *pRVar4;
  undefined4 *puVar5;
  Opnd *pOVar6;
  StackSym *sym;
  RegOpnd *regOpnd;
  Opnd *opnd_local;
  BackwardPass *this_local;
  
  pRVar4 = IR::Opnd::AsRegOpnd(opnd);
  if (pRVar4 == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1843,"(regOpnd != nullptr)","regOpnd != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pSVar1 = pRVar4->m_sym;
  if ((this->tag == BackwardPhase) && (this->currentInstr->m_opcode == Add_A)) {
    pOVar6 = IR::Instr::GetSrc1(this->currentInstr);
    if (pOVar6 == opnd) {
      bVar3 = IsPrePass(this);
      if (!bVar3) {
        bVar3 = IsCollectionPass(this);
        if ((!bVar3) && (this->currentBlock->loop != (Loop *)0x0)) {
          if (this->currentBlock->cloneStrCandidates == (BVSparse<Memory::JitArenaAllocator> *)0x0)
          {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x184d,"(currentBlock->cloneStrCandidates != nullptr)",
                               "currentBlock->cloneStrCandidates != nullptr");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          BVSparse<Memory::JitArenaAllocator>::Set
                    (this->currentBlock->cloneStrCandidates,(pSVar1->super_Sym).m_id);
        }
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::CollectCloneStrCandidate(IR::Opnd * opnd)
{
    IR::RegOpnd *regOpnd = opnd->AsRegOpnd();
    Assert(regOpnd != nullptr);
    StackSym *sym = regOpnd->m_sym;

    if (tag == Js::BackwardPhase
        && currentInstr->m_opcode == Js::OpCode::Add_A
        && currentInstr->GetSrc1() == opnd
        && !this->IsPrePass()
        && !this->IsCollectionPass()
        &&  this->currentBlock->loop)
    {
        Assert(currentBlock->cloneStrCandidates != nullptr);

        currentBlock->cloneStrCandidates->Set(sym->m_id);
    }
}